

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::
     visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
               (string_view full_tag,string_view tag,CountingVisitor *visitor,
               basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *istream,
               int max_recursion)

{
  byte __rhs;
  detail *pdVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long *plVar6;
  runtime_error *prVar7;
  detail *this;
  size_type *psVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  byte *pbVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  detail *pdVar19;
  byte *pbVar20;
  string_view full_tag_00;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  uint8_t discriminator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  detail *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong extraout_RDX_02;
  size_t extraout_RDX_03;
  
  uVar15 = tag._len;
  tags_03._len = (byte *)tag._ptr;
  uVar17 = full_tag._len;
  full_tag_00._ptr = (byte *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,full_tag_00._ptr,full_tag_00._ptr + uVar17);
    std::operator+(&local_a8,"Recursion limit exceeded while visiting tag: ",&local_78);
    std::runtime_error::runtime_error(prVar7,(string *)&local_a8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar15 == 0) {
    return;
  }
  __rhs = *tags_03._len;
  local_80 = uVar17;
  if (__rhs < 0x3c) {
    if (__rhs == 0x28) {
      pdVar19 = (detail *)(tags_03._len + 1);
      pcVar13 = (char *)0x0;
      if (uVar15 != 1) {
        pcVar13 = (char *)(uVar15 - 2);
      }
      visitor->_count = visitor->_count + 1;
      tags_03._ptr = pcVar13;
      pcVar5 = (char *)tag_first_size(pdVar19,tags_03);
      uVar17 = local_80;
      if (pcVar5 != (char *)0x0) {
        pcVar18 = pcVar5;
        if (pcVar13 < pcVar5) {
          pcVar18 = pcVar13;
        }
        pcVar13 = pcVar13 + -(long)pcVar18;
        pdVar1 = (detail *)(pcVar18 + (long)pdVar19);
        do {
          this = pdVar1;
          full_tag_03._len = uVar17;
          full_tag_03._ptr = (char *)full_tag_00._ptr;
          tag_03._len = (size_t)pcVar5;
          tag_03._ptr = (char *)pdVar19;
          visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                    (full_tag_03,tag_03,visitor,istream,max_recursion + -1);
          tags_04._len = extraout_RDX_03;
          tags_04._ptr = pcVar13;
          pcVar5 = (char *)tag_first_size(this,tags_04);
          pcVar18 = pcVar5;
          if (pcVar13 < pcVar5) {
            pcVar18 = pcVar13;
          }
          pcVar13 = pcVar13 + -(long)pcVar18;
          pdVar1 = this + (long)pcVar18;
          pdVar19 = this;
        } while (pcVar5 != (char *)0x0);
      }
      visitor->_count = visitor->_count + 1;
      return;
    }
    if (__rhs == 0x2f) {
      pbVar20 = tags_03._len + 1;
      if (uVar15 < 3) {
        lVar16 = 0;
        if (uVar15 != 1) {
          lVar16 = uVar15 - 2;
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pbVar20,pbVar20 + lVar16);
        std::operator+(&local_78,"Invalid enum tag: \'",&local_50);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_a8._M_dataplus._M_p = (pointer)*plVar6;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_a8._M_dataplus._M_p == psVar8) {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8.field_2._8_8_ = plVar6[3];
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar8;
        }
        local_a8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::runtime_error::runtime_error(prVar7,(string *)&local_a8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a8.field_2._8_8_ = local_a8.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,std::__cxx11::stringstream>
                (*pbVar20,(IntegerToHex *)&local_a8,istream);
      *(char *)(local_a8.field_2._8_8_ + -1) = '\'';
      goto LAB_00146143;
    }
  }
  else {
    if (__rhs == 0x3c) {
      pdVar19 = (detail *)(tags_03._len + 1);
      pcVar13 = (char *)0x0;
      if (uVar15 != 1) {
        pcVar13 = (char *)(uVar15 - 2);
      }
      std::istream::read((char *)istream,(long)&local_a8);
      sVar4 = extraout_RDX_00;
      for (; (char)local_a8._M_dataplus._M_p != '\0';
          local_a8._M_dataplus._M_p._0_1_ = (char)local_a8._M_dataplus._M_p + -1) {
        tags_00._len = sVar4;
        tags_00._ptr = pcVar13;
        pcVar5 = (char *)tag_first_size(pdVar19,tags_00);
        if (pcVar13 < pcVar5) {
          pcVar5 = pcVar13;
        }
        pdVar19 = pdVar19 + (long)pcVar5;
        pcVar13 = pcVar13 + -(long)pcVar5;
        sVar4 = extraout_RDX_01;
      }
      tags_01._len = sVar4;
      tags_01._ptr = pcVar13;
      sVar4 = tag_first_size(pdVar19,tags_01);
      iVar3 = visitor->_count;
      visitor->_count = iVar3 + 1;
      if ((sVar4 == 1) && (*pdVar19 == (detail)0x30)) {
        iVar3 = iVar3 + 2;
        visitor->_count = iVar3;
      }
      else {
        full_tag_04._len = local_80;
        full_tag_04._ptr = (char *)full_tag_00._ptr;
        tag_04._len = sVar4;
        tag_04._ptr = (char *)pdVar19;
        visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                  (full_tag_04,tag_04,visitor,istream,max_recursion + -1);
        iVar3 = visitor->_count;
      }
      visitor->_count = iVar3 + 1;
      return;
    }
    if (__rhs == 0x7b) {
      uVar15 = uVar15 - 1;
      if (uVar15 == 0) {
LAB_001460d2:
        iVar3 = visitor->_count + 1;
        visitor->_count = iVar3;
      }
      else {
        uVar9 = 0;
        do {
          uVar10 = uVar9;
          if (tags_03._len[uVar9] == 0x60) break;
          uVar9 = uVar9 + 1;
          uVar10 = uVar15;
        } while (uVar15 != uVar9);
        uVar9 = uVar10;
        if (uVar15 < uVar10) {
          uVar9 = uVar15;
        }
        lVar16 = uVar15 - uVar9;
        if (lVar16 == 0) {
          pbVar20 = full_tag_00._ptr;
          if (uVar10 != 0) {
LAB_0014603f:
            pbVar14 = pbVar20;
            uVar15 = uVar17;
            if (uVar15 != 0) {
              pbVar20 = pbVar14;
              uVar17 = uVar15;
              do {
                uVar9 = 0;
LAB_0014605b:
                uVar11 = 0xffffffffffffffff;
                if (uVar17 == uVar9) goto LAB_0014608e;
                if (pbVar20[uVar9] == tags_03._len[uVar9]) goto code_r0x00146071;
                pbVar20 = pbVar20 + 1;
                uVar17 = uVar17 - 1;
              } while( true );
            }
          }
          goto LAB_001460d2;
        }
        pbVar20 = tags_03._len + uVar9;
LAB_00145e27:
        visitor->_count = visitor->_count + 1;
        do {
          uVar17 = lVar16 - 1;
          if (uVar17 == 0) {
            uVar15 = 1;
          }
          else {
            uVar9 = 0;
            do {
              uVar15 = uVar9;
              if (pbVar20[uVar9 + 1] == 0x27) break;
              uVar9 = uVar9 + 1;
              uVar15 = uVar17;
            } while (uVar17 != uVar9);
            uVar15 = uVar15 + 1;
          }
          if (uVar17 < uVar15) {
            uVar15 = uVar17;
          }
          pdVar19 = (detail *)(pbVar20 + uVar15 + 1);
          pcVar18 = (char *)(uVar17 - uVar15);
          tags_02._len = uVar10;
          tags_02._ptr = pcVar18;
          pcVar5 = (char *)tag_first_size(pdVar19,tags_02);
          pcVar13 = pcVar5;
          if (pcVar18 < pcVar5) {
            pcVar13 = pcVar18;
          }
          pbVar20 = (byte *)(pcVar13 + (long)pdVar19);
          visitor->_count = visitor->_count + 1;
          full_tag_02._len = local_80;
          full_tag_02._ptr = (char *)full_tag_00._ptr;
          tag_02._len = (size_t)pcVar5;
          tag_02._ptr = (char *)pdVar19;
          visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                    (full_tag_02,tag_02,visitor,istream,max_recursion + -1);
          iVar3 = visitor->_count + 1;
          visitor->_count = iVar3;
          lVar16 = (long)pcVar18 - (long)pcVar13;
          uVar10 = extraout_RDX_02;
joined_r0x001461ad:
        } while (lVar16 != 0);
      }
      visitor->_count = iVar3 + 1;
      return;
    }
    if (__rhs == 0x5b) {
      iVar3 = max_recursion + -1;
      pdVar19 = (detail *)(tags_03._len + 1);
      std::istream::read((char *)istream,(long)&local_a8);
      tags._len = extraout_RDX;
      tags._ptr = (char *)(uVar15 - 1);
      sVar4 = tag_first_size(pdVar19,tags);
      uVar17 = local_80;
      visitor->_count = visitor->_count + 1;
      if (0x20 < (uint)local_a8._M_dataplus._M_p) {
        full_tag_00._len = local_80;
        tag_00._len = sVar4;
        tag_00._ptr = (char *)pdVar19;
        bVar2 = singular_impl(full_tag_00,tag_00,iVar3);
        if (bVar2) {
          visitor->_count = visitor->_count + 1;
          full_tag_01._len = uVar17;
          full_tag_01._ptr = (char *)full_tag_00._ptr;
          tag_01._len = sVar4;
          tag_01._ptr = (char *)pdVar19;
          visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                    (full_tag_01,tag_01,visitor,istream,iVar3);
          visitor->_count = visitor->_count + 1;
          goto LAB_00146026;
        }
      }
      local_58 = pdVar19;
      while ((uint)local_a8._M_dataplus._M_p != 0) {
        local_a8._M_dataplus._M_p._0_4_ = (uint)local_a8._M_dataplus._M_p - 1;
        full_tag_05._len = uVar17;
        full_tag_05._ptr = (char *)full_tag_00._ptr;
        tag_05._len = sVar4;
        tag_05._ptr = (char *)local_58;
        visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                  (full_tag_05,tag_05,visitor,istream,iVar3);
      }
LAB_00146026:
      visitor->_count = visitor->_count + 1;
      return;
    }
  }
  if (__rhs < 0x62) {
    if (__rhs < 0x49) {
      if (__rhs == 0x42) goto switchD_00145f74_caseD_62;
      if (__rhs != 0x44) goto switchD_00145f74_caseD_65;
    }
    else {
      if (__rhs == 0x49) goto switchD_00145f74_caseD_66;
      if (__rhs == 0x4c) goto switchD_00145f74_caseD_64;
      if (__rhs != 0x53) goto switchD_00145f74_caseD_65;
    }
  }
  else {
    switch(__rhs) {
    case 0x62:
    case 99:
switchD_00145f74_caseD_62:
      break;
    case 100:
    case 0x6c:
switchD_00145f74_caseD_64:
      break;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_00145f74_caseD_65:
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Invalid arithmetic tag: ","");
      std::operator+(&local_a8,&local_78,__rhs);
      std::runtime_error::runtime_error(prVar7,(string *)&local_a8);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x66:
    case 0x69:
switchD_00145f74_caseD_66:
      break;
    default:
      if (__rhs != 0x73) {
        if (__rhs != 0x79) goto switchD_00145f74_caseD_65;
        goto switchD_00145f74_caseD_62;
      }
    }
  }
  std::istream::read((char *)istream,(long)&local_a8);
LAB_00146143:
  visitor->_count = visitor->_count + 1;
  return;
code_r0x00146071:
  uVar9 = uVar9 + 1;
  if (uVar10 == uVar9) {
    if (pbVar20 != pbVar14 + uVar15) {
      uVar11 = (long)pbVar20 - (long)pbVar14;
    }
LAB_0014608e:
    uVar9 = uVar11;
    if (uVar15 < uVar11) {
      uVar9 = uVar15;
    }
    uVar17 = uVar15 - uVar9;
    uVar12 = uVar10;
    if (uVar17 < uVar10) {
      uVar12 = uVar17;
    }
    uVar17 = uVar17 - uVar12;
    if ((uVar17 == 0) || (pbVar14[uVar12 + uVar9] == 0x7d)) goto LAB_001460d2;
    pbVar20 = pbVar14 + uVar12 + uVar9;
    if (pbVar14[uVar12 + uVar9] != 0x60) goto LAB_0014603f;
    if (uVar17 == 1) goto LAB_001460d2;
    if (uVar15 <= uVar11) {
      uVar11 = uVar15;
    }
    uVar15 = uVar15 - uVar11;
    uVar9 = uVar10;
    if (uVar15 <= uVar10) {
      uVar9 = uVar15;
    }
    lVar16 = 1;
    uVar10 = 1;
    goto LAB_0014617c;
  }
  goto LAB_0014605b;
LAB_0014617c:
  if (pbVar14[lVar16 + uVar9 + uVar11] == 0x7d) {
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) goto LAB_00145e27;
  }
  else if (pbVar14[lVar16 + uVar9 + uVar11] == 0x7b) {
    uVar10 = uVar10 + 1;
  }
  lVar16 = lVar16 + 1;
  if (uVar15 - uVar9 == lVar16) {
    iVar3 = visitor->_count + 1;
    visitor->_count = iVar3;
    lVar16 = uVar17 - 1;
    goto joined_r0x001461ad;
  }
  goto LAB_0014617c;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}